

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O0

void __thiscall soplex::SPxParMultPR<double>::setType(SPxParMultPR<double> *this,Type tp)

{
  int in_ESI;
  long in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  VectorBase<double> *in_stack_00000020;
  Pricing pr;
  undefined4 in_stack_fffffffffffffff0;
  
  pr = (Pricing)((ulong)in_RDI >> 0x20);
  if (in_ESI == -1) {
    *(undefined4 *)(in_RDI + 0x54) = 0;
    SPxSolverBase<double>::setPricing
              ((SPxSolverBase<double> *)CONCAT44(0xffffffff,in_stack_fffffffffffffff0),pr);
  }
  else {
    SPxSolverBase<double>::setPricing
              ((SPxSolverBase<double> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pr);
  }
  VectorBase<double>::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  VectorBase<double>::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x8e0) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x60) / 2;
  return;
}

Assistant:

void SPxParMultPR<R>::setType(typename SPxSolverBase<R>::Type tp)
{
   if(tp == SPxSolverBase<R>::ENTER)
   {
      used = 0;
      this->thesolver->setPricing(SPxSolverBase<R>::PARTIAL);
   }
   else
   {
      this->thesolver->setPricing(SPxSolverBase<R>::FULL);
   }

   this->thesolver->weights.reDim(0);
   this->thesolver->coWeights.reDim(0);
   this->thesolver->weightsAreSetup = false;

   last = 0;
   min = partialSize / 2;
}